

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  TestRunInfo *in_RSI;
  CumulativeReporterBase *in_RDI;
  CumulativeReporterBase *name;
  XmlWriter *this_00;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  CumulativeReporterBase::testRunStarting(in_RDI,in_RSI);
  name = in_RDI + 1;
  this_00 = (XmlWriter *)&stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  operator|(Newline,Indent);
  XmlWriter::startElement(this_00,(string *)name,(XmlFormatting)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  Timer::start((Timer *)in_RDI);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  *(undefined4 *)&in_RDI[1].m_deepestSection = 0;
  return;
}

Assistant:

void JunitReporter::testRunStarting( TestRunInfo const& runInfo )  {
        CumulativeReporterBase::testRunStarting( runInfo );
        xml.startElement( "testsuites" );
        suiteTimer.start();
        stdOutForSuite.clear();
        stdErrForSuite.clear();
        unexpectedExceptions = 0;
    }